

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall cppnet::Dispatcher::DoTask(Dispatcher *this)

{
  size_type sVar1;
  reference this_00;
  ulong local_50;
  size_t i;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> func_vec;
  Dispatcher *this_local;
  
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
             &lock._M_owns);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_38,&this->_task_list_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::swap
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
             &lock._M_owns,&this->_task_list);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  local_50 = 0;
  while( true ) {
    sVar1 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                      ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                       &lock._M_owns);
    if (sVar1 <= local_50) break;
    this_00 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
              operator[]((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                         )&lock._M_owns,local_50);
    std::function<void_()>::operator()(this_00);
    local_50 = local_50 + 1;
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
             &lock._M_owns);
  return;
}

Assistant:

void Dispatcher::DoTask() {
    std::vector<Task> func_vec;
    {
        std::unique_lock<std::mutex> lock(_task_list_mutex);
        func_vec.swap(_task_list);
    }

    for (std::size_t i = 0; i < func_vec.size(); ++i) {
        func_vec[i]();
    }
}